

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O0

Path * kj::anon_unknown_9::DiskFilesystem::computeCurrentPath(void)

{
  bool bVar1;
  NullableValue<kj::Exception> *other;
  Exception *pEVar2;
  Path *pPVar3;
  char *pcVar4;
  int *piVar5;
  anon_class_32_4_9aafd9ab *func;
  Path *in_RDI;
  ArrayPtr<char> AVar6;
  StringPtr path_00;
  Fault local_670;
  Fault f_2;
  bool local_652;
  DebugExpression<bool> local_651;
  DebugExpression<bool> _kjCondition_1;
  Fault f_1;
  bool local_632;
  DebugExpression<bool> local_631;
  undefined1 local_630 [7];
  DebugExpression<bool> _kjCondition;
  StringPtr path;
  Fault f;
  undefined1 auStack_610 [4];
  int error;
  ArrayPtr<char> buf;
  Array<char> buf_heap;
  char buf_stack [256];
  bool buf_isOnStack;
  size_t buf_size;
  size_t size;
  int local_4c0;
  bool _kj_shouldLog_1;
  bool _kj_shouldLog;
  Exception *e;
  ArrayDisposer **local_4a0;
  __syscall_slong_t *local_498;
  __syscall_slong_t *local_490;
  undefined1 *local_488;
  Maybe<kj::Exception> local_480;
  undefined1 local_2e8 [8];
  NullableValue<kj::Exception> _e1698;
  stat dotStat;
  stat pwdStat;
  Path result;
  char *pwd;
  
  result.parts.disposer = (ArrayDisposer *)getenv("PWD");
  if (result.parts.disposer == (ArrayDisposer *)0x0) goto LAB_0037acff;
  Path::Path((Path *)(pwdStat.__glibc_reserved + 2),(void *)0x0);
  local_4a0 = &result.parts.disposer;
  local_490 = dotStat.__glibc_reserved + 2;
  local_488 = (undefined1 *)((long)&_e1698.field_1 + 0x188);
  local_498 = pwdStat.__glibc_reserved + 2;
  runCatchingExceptions<kj::(anonymous_namespace)::DiskFilesystem::computeCurrentPath()::_lambda()_1_>
            (&local_480,(kj *)&local_4a0,func);
  other = _::readMaybe<kj::Exception>(&local_480);
  _::NullableValue<kj::Exception>::NullableValue((NullableValue<kj::Exception> *)local_2e8,other);
  Maybe<kj::Exception>::~Maybe(&local_480);
  pEVar2 = _::NullableValue::operator_cast_to_Exception_((NullableValue *)local_2e8);
  if (pEVar2 == (Exception *)0x0) {
    if ((pwdStat.st_dev != dotStat.st_dev) ||
       ((ArrayDisposer *)dotStat.__glibc_reserved[2] !=
        _e1698.field_1.value.details.builder.disposer)) {
      size._7_1_ = _::Debug::shouldLog(INFO);
      while (size._7_1_ != false) {
        _::Debug::log<char_const(&)[57],char_const*&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                   ,0x6b1,INFO,"\"PWD environment variable doesn\'t match current directory\", pwd",
                   (char (*) [57])"PWD environment variable doesn\'t match current directory",
                   (char **)&result.parts.disposer);
        size._7_1_ = false;
      }
      goto LAB_0037aca9;
    }
    pPVar3 = mv<kj::Path>((Path *)(pwdStat.__glibc_reserved + 2));
    Path::Path(in_RDI,pPVar3);
    bVar1 = true;
  }
  else {
    pEVar2 = _::NullableValue<kj::Exception>::operator*((NullableValue<kj::Exception> *)local_2e8);
    _kj_shouldLog_1 = _::Debug::shouldLog(WARNING);
    while (_kj_shouldLog_1 != false) {
      _::Debug::log<char_const(&)[39],char_const*&,kj::Exception&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                 ,0x6a4,WARNING,"\"PWD environment variable seems invalid\", pwd, e",
                 (char (*) [39])"PWD environment variable seems invalid",
                 (char **)&result.parts.disposer,pEVar2);
      _kj_shouldLog_1 = false;
    }
LAB_0037aca9:
    bVar1 = false;
  }
  _::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)local_2e8);
  if (!bVar1) {
    bVar1 = false;
  }
  Path::~Path((Path *)(pwdStat.__glibc_reserved + 2));
  if (bVar1) {
    return in_RDI;
  }
LAB_0037acff:
  buf_size = 0x100;
  do {
    if (buf_size < 0x101) {
      Array<char>::Array((Array<char> *)&buf.size_,(void *)0x0);
      AVar6 = arrayPtr<char>((char *)&buf_heap.disposer,buf_size);
    }
    else {
      heapArray<char>((Array<char> *)&buf.size_,buf_size);
      AVar6 = kj::Array::operator_cast_to_ArrayPtr((Array *)&buf.size_);
    }
    buf.ptr = (char *)AVar6.size_;
    _auStack_610 = AVar6.ptr;
    pcVar4 = ArrayPtr<char>::begin((ArrayPtr<char> *)auStack_610);
    pcVar4 = getcwd(pcVar4,buf_size);
    if (pcVar4 == (char *)0x0) {
      piVar5 = __errno_location();
      if (*piVar5 != 0x22) {
        _::Debug::Fault::Fault
                  ((Fault *)&path.content.size_,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                   ,0x6bf,*piVar5,"getcwd()","");
        _::Debug::Fault::fatal((Fault *)&path.content.size_);
      }
      buf_size = buf_size << 1;
      local_4c0 = 8;
    }
    else {
      pcVar4 = ArrayPtr<char>::begin((ArrayPtr<char> *)auStack_610);
      StringPtr::StringPtr((StringPtr *)local_630,pcVar4);
      StringPtr::StringPtr((StringPtr *)&f_1,"(unreachable)");
      bVar1 = StringPtr::startsWith((StringPtr *)local_630,(StringPtr *)&f_1);
      local_632 = (bool)(~bVar1 & 1);
      local_631 = _::DebugExpressionStart::operator<<
                            ((DebugExpressionStart *)&_::MAGIC_ASSERT,&local_632);
      bVar1 = _::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_631);
      if (!bVar1) {
        _::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[45],kj::StringPtr&>
                  ((Fault *)&stack0xfffffffffffff9b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                   ,0x6c8,FAILED,"!path.startsWith(\"(unreachable)\")",
                   "_kjCondition,\"working directory is not reachable from root\", path",&local_631,
                   (char (*) [45])"working directory is not reachable from root",
                   (StringPtr *)local_630);
        _::Debug::Fault::fatal((Fault *)&stack0xfffffffffffff9b0);
      }
      StringPtr::StringPtr((StringPtr *)&f_2,"/");
      local_652 = StringPtr::startsWith((StringPtr *)local_630,(StringPtr *)&f_2);
      local_651 = _::DebugExpressionStart::operator<<
                            ((DebugExpressionStart *)&_::MAGIC_ASSERT,&local_652);
      bVar1 = _::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_651);
      if (!bVar1) {
        _::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[34],kj::StringPtr&>
                  (&local_670,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                   ,0x6c9,FAILED,"path.startsWith(\"/\")",
                   "_kjCondition,\"current directory is not absolute\", path",&local_651,
                   (char (*) [34])"current directory is not absolute",(StringPtr *)local_630);
        _::Debug::Fault::fatal(&local_670);
      }
      path_00 = StringPtr::slice((StringPtr *)local_630,1);
      Path::parse(in_RDI,path_00);
      local_4c0 = 1;
    }
    Array<char>::~Array((Array<char> *)&buf.size_);
    if (local_4c0 == 1) {
      return in_RDI;
    }
  } while( true );
}

Assistant:

static Path computeCurrentPath() {
    // If env var PWD is set and points to the current directory, use it. This captures the current
    // path according to the user's shell, which may differ from the kernel's idea in the presence
    // of symlinks.
    const char* pwd = getenv("PWD");
    if (pwd != nullptr) {
      Path result = nullptr;
      struct stat pwdStat, dotStat;
      KJ_IF_SOME(e, kj::runCatchingExceptions([&]() {
        KJ_ASSERT(pwd[0] == '/') { return; }
        result = Path::parse(pwd + 1);
        KJ_SYSCALL(lstat(result.toString(true).cStr(), &pwdStat), result) { return; }
        KJ_SYSCALL(lstat(".", &dotStat)) { return; }
      })) {
        // failed, give up on PWD
        KJ_LOG(WARNING, "PWD environment variable seems invalid", pwd, e);
      } else {
        if (pwdStat.st_ino == dotStat.st_ino &&
            pwdStat.st_dev == dotStat.st_dev) {
          return kj::mv(result);
        } else {
          // It appears PWD doesn't actually point at the current directory. In practice, only
          // shells tend to update PWD. Other programs, like build tools, may do `chdir()` without
          // actually updating PWD to match. Arguably they are buggy, but realistically we have to
          // live with them. So, we will treat an incorrect PWD the same as an absent PWD, and fall
          // back to using the current directory's canonical path.
          //
          // We used to log a WARNING here but it was deemed too noisy, so we changed it to INFO.
          KJ_LOG(INFO, "PWD environment variable doesn't match current directory", pwd);
        }
      }